

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kfindxx.cpp
# Opt level: O0

void parse_args(int argc,char **argv,int *min,int *max)

{
  char *__s;
  undefined8 max_00;
  int *piVar1;
  invalid_argument *anon_var_0;
  string local_160;
  string local_140;
  string local_120;
  int local_100;
  allocator<char> local_f9;
  int component_no;
  allocator<char> local_d1;
  string local_d0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  long local_88;
  size_t pos [4];
  allocator<char> local_49;
  string local_48 [8];
  string arg;
  int *max_local;
  int *min_local;
  char **argv_local;
  int argc_local;
  
  if (1 < argc) {
    __s = argv[1];
    arg.field_2._8_8_ = max;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,__s,&local_49);
    std::allocator<char>::~allocator(&local_49);
    local_88 = std::__cxx11::string::find((char)local_48,0x2e);
    if (local_88 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"expected 3 dots (got 0)",&local_a9);
      abort_parsing(argv,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      local_b0 = 1;
    }
    else {
      pos[0] = std::__cxx11::string::find((char)local_48,0x2e);
      if (pos[0] == 0xffffffffffffffff) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"expected 3 dots (got 1)",&local_d1);
        abort_parsing(argv,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        local_b0 = 1;
      }
      else {
        pos[1] = std::__cxx11::string::find((char)local_48,0x2e);
        if (pos[1] == 0xffffffffffffffff) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&component_no,"expected 3 dots (got 2)",&local_f9);
          abort_parsing(argv,(string *)&component_no);
          std::__cxx11::string::~string((string *)&component_no);
          std::allocator<char>::~allocator(&local_f9);
          local_b0 = 1;
        }
        else {
          pos[2] = std::__cxx11::string::size();
          max_00 = arg.field_2._8_8_;
          local_100 = 1;
          std::__cxx11::string::substr((ulong)&local_120,(ulong)local_48);
          parse_range(min,(int *)max_00,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          local_100 = local_100 + 1;
          piVar1 = (int *)(arg.field_2._8_8_ + 4);
          std::__cxx11::string::substr((ulong)&local_140,(ulong)local_48);
          parse_range(min + 1,piVar1,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          local_100 = local_100 + 1;
          piVar1 = (int *)(arg.field_2._8_8_ + 8);
          std::__cxx11::string::substr((ulong)&local_160,(ulong)local_48);
          parse_range(min + 2,piVar1,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          local_100 = local_100 + 1;
          piVar1 = (int *)(arg.field_2._8_8_ + 0xc);
          std::__cxx11::string::substr((ulong)&anon_var_0,(ulong)local_48);
          parse_range(min + 3,piVar1,(string *)&anon_var_0);
          std::__cxx11::string::~string((string *)&anon_var_0);
          local_b0 = 0;
        }
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void
parse_args(int argc, char *argv[], int min[4], int max[4])
{
    if (argc < 2) {
        return;
    }

    std::string arg{argv[1]};
    std::size_t pos[4];

    pos[0] = arg.find('.');
    if (pos[0] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 0)");
        return;
    }

    pos[1] = arg.find('.', pos[0] + 1);
    if (pos[1] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 1)");
        return;
    }

    pos[2] = arg.find('.', pos[1] + 1);
    if (pos[2] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 2)");
        return;
    }

    pos[3] = arg.size();

    int component_no = 1;
    try {
        parse_range(min[0], max[0], arg.substr(0, pos[0]));
        ++component_no;

        parse_range(min[1], max[1], arg.substr(pos[0] + 1, pos[1] - pos[0] - 1));
        ++component_no;

        parse_range(min[2], max[2], arg.substr(pos[1] + 1, pos[2] - pos[1] - 1));
        ++component_no;

        parse_range(min[3], max[3], arg.substr(pos[2] + 1, pos[3] - pos[2] - 1));
    } catch (const std::invalid_argument&) {
        abort_parsing(argv, "invalid range specified (component " + std::to_string(component_no) + ")");
    }
}